

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void addps_VW(PDISASM pMyDisasm)

{
  Int32 IVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      IVar1 = 0x110000;
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        IVar1 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar1;
      (pMyDisasm->Instruction).Category = (pMyDisasm->Instruction).Category + 2;
      strcpy((pMyDisasm->Instruction).Mnemonic,"vaddsd");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      GyEy(pMyDisasm);
    }
    else {
      (pMyDisasm->Prefix).RepnePrefix = '\b';
      (pMyDisasm->Instruction).Category = 0x50002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"addsd");
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  else if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      IVar1 = 0x110000;
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        IVar1 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar1;
      (pMyDisasm->Instruction).Category = (pMyDisasm->Instruction).Category + 2;
      strcpy((pMyDisasm->Instruction).Mnemonic,"vaddss");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      GyEy(pMyDisasm);
    }
    else {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Instruction).Category = 0x40002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"addss");
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      IVar1 = 0x110000;
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        IVar1 = 0x140000;
      }
      (pMyDisasm->Instruction).Category = IVar1;
      (pMyDisasm->Instruction).Category = (pMyDisasm->Instruction).Category + 2;
      strcpy((pMyDisasm->Instruction).Mnemonic,"vaddpd");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
      }
      if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      ArgsVEX(pMyDisasm);
    }
    else {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x50002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"addpd");
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    IVar1 = 0x110000;
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      IVar1 = 0x140000;
    }
    (pMyDisasm->Instruction).Category = IVar1;
    (pMyDisasm->Instruction).Category = (pMyDisasm->Instruction).Category + 2;
    strcpy((pMyDisasm->Instruction).Mnemonic,"vaddps");
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    }
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = 0x40;
    }
    ArgsVEX(pMyDisasm);
  }
  else {
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Instruction).Category = 0x40002;
    strcpy((pMyDisasm->Instruction).Mnemonic,"addps");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
  }
  return;
}

Assistant:

void __bea_callspec__ addps_VW(PDISASM pMyDisasm)
{
  /* ========= 0xf2 */
  if (GV.PrefRepne == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddsd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg3qword;
      GyEy(pMyDisasm);
    }
    else {
      pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addsd");
      #endif
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg2qword;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
   /* ========= 0xf3 */
  else if (GV.PrefRepe == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddss");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      GV.Register_ = SSE_REG;
      GV.MemDecoration = Arg3dword;
      GyEy(pMyDisasm);
    }
    else {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      GV.MemDecoration = Arg2dword;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addss");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
  /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddpd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
    }
    else {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128d_xmm;
      pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addpd");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
  else {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaddps");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
    }
     else {
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "addps");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
     }
  }
}